

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

exr_result_t exr_encoding_run(exr_const_context_t ctxt,int part_index,exr_encode_pipeline_t *encode)

{
  undefined8 *puVar1;
  size_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_coding_channel_info_t *encc;
  int c;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  uint64_t packed_bytes;
  exr_result_t rv;
  uint local_44;
  _internal_exr_part *sz;
  size_t sVar2;
  exr_transcoding_pipeline_buffer_id_t bufid;
  uint in_stack_ffffffffffffffd8;
  exr_result_t eVar3;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *p_Var4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar3 = 0;
  sVar2 = 0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar3 = 2;
  }
  else {
    p_Var4 = in_RDI;
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      eVar3 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      sz = in_RDI->parts[(int)in_ESI];
      if (in_RDX == (size_t *)0x0) {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        eVar3 = (*in_RDI->standard_error)(in_RDI,3);
      }
      else if (((_internal_exr_context *)in_RDX[2] == p_Var4) &&
              (*(uint *)((long)in_RDX + 0xc) == in_ESI)) {
        if (((sz->storage_mode == EXR_STORAGE_DEEP_SCANLINE) ||
            (sz->storage_mode == EXR_STORAGE_DEEP_TILED)) &&
           ((in_RDX[0xf] == 0 ||
            (in_RDX[0x10] != (long)(int)in_RDX[5] * (long)*(int *)((long)in_RDX + 0x24) * 4)))) {
          if (in_RDI->mode == '\x01') {
            internal_exr_unlock(in_RDI);
          }
          eVar3 = (*in_RDI->report_error)
                            (in_RDI,3,"Invalid / missing sample count table for deep data");
        }
        else {
          for (local_44 = 0; (int)local_44 < (int)(short)in_RDX[1]; local_44 = local_44 + 1) {
            puVar1 = (undefined8 *)(*in_RDX + (long)(int)local_44 * 0x30);
            if (*(int *)(puVar1 + 1) != 0) {
              if (*(int *)((long)puVar1 + 0xc) == 0) {
                if (in_RDI->mode == '\x01') {
                  internal_exr_unlock(in_RDI);
                }
                eVar3 = (*in_RDI->print_error)(in_RDI,3,"Unexpected 0-width chunk to encode");
                return eVar3;
              }
              if (puVar1[5] == 0) {
                if (in_RDI->mode == '\x01') {
                  internal_exr_unlock(in_RDI);
                }
                eVar3 = (*in_RDI->print_error)
                                  (in_RDI,3,
                                   "Missing channel data pointer - must encode all channels");
                return eVar3;
              }
              if ((*(short *)((long)puVar1 + 0x1c) != 2) && (*(short *)((long)puVar1 + 0x1c) != 4))
              {
                if (in_RDI->mode == '\x01') {
                  internal_exr_unlock(in_RDI);
                }
                eVar3 = (*in_RDI->print_error)
                                  (in_RDI,3,
                                   "Invalid / unsupported output bytes per element (%d) for channel %c (%s)"
                                   ,(ulong)(uint)(int)*(short *)((long)puVar1 + 0x1c),
                                   (ulong)local_44,*puVar1);
                return eVar3;
              }
              if (((*(short *)((long)puVar1 + 0x1e) != 1) && (*(short *)((long)puVar1 + 0x1e) != 2))
                 && (*(short *)((long)puVar1 + 0x1e) != 0)) {
                if (in_RDI->mode == '\x01') {
                  internal_exr_unlock(in_RDI);
                }
                eVar3 = (*in_RDI->print_error)
                                  (in_RDI,3,
                                   "Invalid / unsupported output data type (%d) for channel %c (%s)"
                                   ,(ulong)*(ushort *)((long)puVar1 + 0x1e),(ulong)local_44,*puVar1)
                ;
                return eVar3;
              }
              sVar2 = (long)*(int *)(puVar1 + 1) * (long)*(int *)((long)puVar1 + 0xc) *
                      (long)*(char *)((long)puVar1 + 0x19) + sVar2;
            }
          }
          in_RDX[0xd] = 0;
          if (in_RDX[0x1d] == 0) {
            if ((in_RDX[0xc] == 0) || (sVar2 != in_RDX[0x15])) {
              if (in_RDI->mode == '\x01') {
                internal_exr_unlock(in_RDI);
              }
              eVar3 = (*in_RDI->report_error)
                                (in_RDI,3,
                                 "Encode pipeline has no packing function declared and packed buffer is null or appears to need packing"
                                );
              return eVar3;
            }
          }
          else if ((sVar2 != 0) &&
                  (eVar3 = internal_encode_alloc_buffer
                                     ((exr_encode_pipeline_t *)
                                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                      (exr_transcoding_pipeline_buffer_id_t)((ulong)p_Var4 >> 0x20),
                                      (void **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                                      CONCAT44(eVar3,in_stack_ffffffffffffffd8)), eVar3 == 0)) {
            eVar3 = (*(code *)in_RDX[0x1d])(in_RDX);
          }
          bufid = (exr_transcoding_pipeline_buffer_id_t)(sVar2 >> 0x20);
          if (in_RDI->mode == '\x01') {
            internal_exr_unlock(in_RDI);
          }
          if (((sz->storage_mode == EXR_STORAGE_DEEP_SCANLINE) ||
              (sz->storage_mode == EXR_STORAGE_DEEP_TILED)) && (in_RDX[0xf] != 0)) {
            priv_from_native32((void *)in_RDX[0xf],(int)in_RDX[5] * *(int *)((long)in_RDX + 0x24));
          }
          if (eVar3 == 0) {
            if ((in_RDX[0x1e] == 0) || (in_RDX[0xd] == 0)) {
              internal_encode_free_buffer
                        ((exr_encode_pipeline_t *)(ulong)in_stack_ffffffffffffffd8,bufid,
                         (void **)in_RDI,(size_t *)sz);
              internal_encode_free_buffer
                        ((exr_encode_pipeline_t *)CONCAT44(eVar3,in_stack_ffffffffffffffd8),bufid,
                         (void **)in_RDI,(size_t *)sz);
              in_RDX[0x14] = in_RDX[0xc];
              in_RDX[0x15] = in_RDX[0xd];
              in_RDX[0x16] = 0;
              in_RDX[0x11] = in_RDX[0xf];
              in_RDX[0x13] = 0;
              in_RDX[0x12] = (long)(int)in_RDX[5] * (long)*(int *)((long)in_RDX + 0x24) * 4;
            }
            else {
              eVar3 = (*(code *)in_RDX[0x1e])(in_RDX);
            }
          }
          if ((eVar3 == 0) && (in_RDX[0x1f] != 0)) {
            eVar3 = (*(code *)in_RDX[0x1f])(in_RDX);
          }
          if ((eVar3 == 0) && (in_RDX[0x20] != 0)) {
            eVar3 = (*(code *)in_RDX[0x20])(in_RDX);
          }
          if (((sz->storage_mode == EXR_STORAGE_DEEP_SCANLINE) ||
              (sz->storage_mode == EXR_STORAGE_DEEP_TILED)) && (in_RDX[0xf] != 0)) {
            priv_to_native32((void *)in_RDX[0xf],(int)in_RDX[5] * *(int *)((long)in_RDX + 0x24));
          }
        }
      }
      else {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        eVar3 = (*in_RDI->report_error)
                          (in_RDI,3,
                           "Invalid request for encoding update from different context / part");
      }
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_encoding_run (
    exr_const_context_t ctxt, int part_index, exr_encode_pipeline_t* encode)
{
    exr_result_t rv           = EXR_ERR_SUCCESS;
    uint64_t     packed_bytes = 0;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!encode)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));
    if (encode->context != ctxt || encode->part_index != part_index)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for encoding update from different context / part"));

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        if (encode->sample_count_table == NULL ||
            encode->sample_count_alloc_size !=
                (((size_t) encode->chunk.width) *
                 ((size_t) encode->chunk.height) * sizeof (int32_t)))
        {
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->report_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / missing sample count table for deep data"));
        }
    }

    for (int c = 0; c < encode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* encc = (encode->channels + c);

        if (encc->height == 0) continue;

        if (encc->width == 0)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Unexpected 0-width chunk to encode"));
        if (!encc->encode_from_ptr)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Missing channel data pointer - must encode all channels"));

        /*
         * if a user specifies a bad pixel stride / line stride
         * we can't know this realistically, and they may want to
         * use 0 to cause things to collapse for testing purposes
         * so only test the values we can
         */
        if (encc->user_bytes_per_element != 2 &&
            encc->user_bytes_per_element != 4)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output bytes per element (%d) for channel %c (%s)",
                (int) encc->user_bytes_per_element,
                c,
                encc->channel_name));

        if (encc->user_data_type != (uint16_t) (EXR_PIXEL_HALF) &&
            encc->user_data_type != (uint16_t) (EXR_PIXEL_FLOAT) &&
            encc->user_data_type != (uint16_t) (EXR_PIXEL_UINT))
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output data type (%d) for channel %c (%s)",
                (int) encc->user_data_type,
                c,
                encc->channel_name));

        packed_bytes +=
            ((uint64_t) (encc->height) * (uint64_t) (encc->width) *
             (uint64_t) (encc->bytes_per_element));
    }

    encode->packed_bytes = 0;
    if (encode->convert_and_pack_fn)
    {
        if (packed_bytes > 0)
        {
            rv = internal_encode_alloc_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED,
                (void**) &(encode->packed_buffer),
                &(encode->packed_alloc_size),
                packed_bytes);

            if (rv == EXR_ERR_SUCCESS)
                rv = encode->convert_and_pack_fn (encode);
        }
    }
    else if (!encode->packed_buffer || packed_bytes != encode->compressed_bytes)
    {
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Encode pipeline has no packing function declared and packed buffer is null or appears to need packing"));
    }
    EXR_UNLOCK_WRITE (pctxt);

    if ((part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED) &&
        encode->sample_count_table != NULL)
    {
        priv_from_native32 (
            encode->sample_count_table,
            encode->chunk.width * encode->chunk.height);
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        if (encode->compress_fn && encode->packed_bytes > 0)
        {
            rv = encode->compress_fn (encode);
        }
        else
        {
            internal_encode_free_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_COMPRESSED,
                &(encode->compressed_buffer),
                &(encode->compressed_alloc_size));

            internal_encode_free_buffer (
                encode,
                EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                &(encode->packed_sample_count_table),
                &(encode->packed_sample_count_alloc_size));

            encode->compressed_buffer     = encode->packed_buffer;
            encode->compressed_bytes      = encode->packed_bytes;
            encode->compressed_alloc_size = 0;

            encode->packed_sample_count_table      = encode->sample_count_table;
            encode->packed_sample_count_alloc_size = 0;
            encode->packed_sample_count_bytes =
                (((size_t) encode->chunk.width) *
                 ((size_t) encode->chunk.height) * sizeof (int32_t));
        }
    }

    if (rv == EXR_ERR_SUCCESS && encode->yield_until_ready_fn)
        rv = encode->yield_until_ready_fn (encode);

    if (rv == EXR_ERR_SUCCESS && encode->write_fn)
        rv = encode->write_fn (encode);

    if ((part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED) &&
        encode->sample_count_table != NULL)
    {
        priv_to_native32 (
            encode->sample_count_table,
            encode->chunk.width * encode->chunk.height);
    }

    return rv;
}